

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)

{
  ImGuiWindow *potential_parent;
  ImGuiWindow *window;
  bool bVar1;
  
  potential_parent = GImGui->CurrentWindow;
  if (potential_parent == (ImGuiWindow *)0x0) {
    __assert_fail("g.CurrentWindow",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x1b2e,"bool ImGui::IsWindowFocused(ImGuiFocusedFlags)");
  }
  if ((flags & 4U) == 0) {
    window = GImGui->NavWindow;
    switch(flags & 3) {
    case 0:
      bVar1 = window == potential_parent;
      break;
    case 1:
      if (window == (ImGuiWindow *)0x0) {
        return false;
      }
      bVar1 = IsWindowChildOf(window,potential_parent);
      return bVar1;
    case 2:
      bVar1 = window == potential_parent->RootWindow;
      break;
    case 3:
      if (window == (ImGuiWindow *)0x0) {
        return false;
      }
      bVar1 = window->RootWindow == potential_parent->RootWindow;
    }
    return bVar1;
  }
  return GImGui->NavWindow != (ImGuiWindow *)0x0;
}

Assistant:

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.CurrentWindow);     // Not inside a Begin()/End()

    if (flags & ImGuiFocusedFlags_AnyWindow)
        return g.NavWindow != NULL;

    switch (flags & (ImGuiFocusedFlags_RootWindow | ImGuiFocusedFlags_ChildWindows))
    {
    case ImGuiFocusedFlags_RootWindow | ImGuiFocusedFlags_ChildWindows:
        return g.NavWindow && g.NavWindow->RootWindow == g.CurrentWindow->RootWindow;
    case ImGuiFocusedFlags_RootWindow:
        return g.NavWindow == g.CurrentWindow->RootWindow;
    case ImGuiFocusedFlags_ChildWindows:
        return g.NavWindow && IsWindowChildOf(g.NavWindow, g.CurrentWindow);
    default:
        return g.NavWindow == g.CurrentWindow;
    }
}